

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

char * XPMPSoundAdd(char *sName,char *filePath,bool bLoop,float coneDir,float conePitch,
                   float coneInAngle,float coneOutAngle,float coneOutVol)

{
  long *plVar1;
  undefined1 uVar2;
  byte bVar3;
  byte in_DL;
  char *in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM4_Da;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [8];
  string *in_stack_ffffffffffffff80;
  allocator<char> local_51;
  string local_50 [16];
  byte bVar4;
  char *local_8;
  
  bVar4 = in_DL & 1;
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_51;
  __s = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,__s,(allocator<char> *)
                      CONCAT17(in_stack_ffffffffffffff37,
                               CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  uVar2 = XPMP2::ExistsFile(in_stack_ffffffffffffff80);
  bVar3 = uVar2 ^ 0xff;
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  plVar1 = XPMP2::gpSndSys;
  if ((bVar3 & 1) == 0) {
    if (XPMP2::gpSndSys == (long *)0x0) {
      local_8 = "No sound system available";
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,__s,(allocator<char> *)
                          CONCAT17(uVar2,CONCAT16(bVar3,in_stack_ffffffffffffff30)));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this,__s,(allocator<char> *)
                          CONCAT17(uVar2,CONCAT16(bVar3,in_stack_ffffffffffffff30)));
      bVar3 = (**(code **)(*plVar1 + 0x10))
                        (in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,plVar1,local_88,
                         local_b0,bVar4 & 1);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        local_8 = "";
      }
      else {
        local_8 = "Failed loading the sound file";
      }
    }
  }
  else {
    if (XPMP2::glob < 4) {
      XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Sound.cpp"
                    ,0x45a,"XPMPSoundAdd",logERR,"Sound file not found: %s",in_RSI);
    }
    local_8 = "Sound File not found";
  }
  return local_8;
}

Assistant:

const char* XPMPSoundAdd (const char* sName,
                          const char* filePath,
                          bool bLoop,
                          float coneDir, float conePitch,
                          float coneInAngle, float coneOutAngle,
                          float coneOutVol)
{
    // Test file existence first before bothering
    if (!XPMP2::ExistsFile(filePath)) {
        LOG_MSG(XPMP2::logERR, "Sound file not found: %s", filePath)
        return "Sound File not found";
    }
    // No sound system yet available?
    if (!XPMP2::gpSndSys)
        return "No sound system available";
    // Load the sound and add it to the map
    if (!XPMP2::gpSndSys->LoadSoundFile(sName, filePath, bLoop,
                                       coneDir, conePitch, coneInAngle,
                                       coneOutAngle, coneOutVol))
        return "Failed loading the sound file";
    
    // All good
    return "";
}